

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_clock.c
# Opt level: O3

void mk_clock_log_set_time(time_t utime,mk_server *server)

{
  mk_clock_context *pmVar1;
  tm *__tp;
  char *__s;
  tm result;
  time_t local_50;
  tm local_48;
  
  pmVar1 = server->clock_context;
  __s = pmVar1->log_time_buffers[0];
  if (__s == (pmVar1->log_current_time).data) {
    __s = pmVar1->log_time_buffers[1];
  }
  pmVar1->log_current_utime = utime;
  local_50 = utime;
  __tp = localtime_r(&local_50,&local_48);
  strftime(__s,0x1e,"[%d/%b/%G %T %z]",__tp);
  (server->clock_context->log_current_time).data = __s;
  return;
}

Assistant:

static void mk_clock_log_set_time(time_t utime, struct mk_server *server)
{
    char *time_string;
    struct tm result;

    time_string = _next_buffer(&server->clock_context->log_current_time, server->clock_context->log_time_buffers);
    server->clock_context->log_current_utime = utime;

    strftime(time_string, LOG_TIME_BUFFER_SIZE, "[%d/%b/%G %T %z]",
             localtime_r(&utime, &result));

    server->clock_context->log_current_time.data = time_string;
}